

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O3

void __thiscall QToolBoxPrivate::relayout(QToolBoxPrivate *this)

{
  QWidget *parent;
  pointer puVar1;
  QLayout *this_00;
  unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_> *page;
  pointer puVar2;
  long in_FS_OFFSET;
  QMargins local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  if (this->layout != (QVBoxLayout *)0x0) {
    (**(code **)(*(long *)&(this->layout->super_QBoxLayout).super_QLayout + 0x20))();
  }
  this_00 = (QLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)this_00,parent);
  this->layout = (QVBoxLayout *)this_00;
  local_38.m_left.m_i = 0;
  local_38.m_top.m_i = 0;
  local_38.m_right.m_i = 0;
  local_38.m_bottom.m_i = 0;
  QLayout::setContentsMargins(this_00,&local_38);
  puVar1 = (this->pageList).
           super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar2 = (this->pageList).
                super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    QBoxLayout::addWidget
              (&this->layout->super_QBoxLayout,
               (QWidget *)
               ((puVar2->_M_t).
                super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                ._M_t.
                super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl)->button,0,
               (Alignment)0x0);
    QBoxLayout::addWidget
              (&this->layout->super_QBoxLayout,
               (QWidget *)
               ((puVar2->_M_t).
                super___uniq_ptr_impl<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>
                ._M_t.
                super__Tuple_impl<0UL,_QToolBoxPrivate::Page_*,_std::default_delete<QToolBoxPrivate::Page>_>
                .super__Head_base<0UL,_QToolBoxPrivate::Page_*,_false>._M_head_impl)->sv,0,
               (Alignment)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBoxPrivate::relayout()
{
    Q_Q(QToolBox);
    delete layout;
    layout = new QVBoxLayout(q);
    layout->setContentsMargins(QMargins());
    for (const auto &page : pageList) {
        layout->addWidget(page->button);
        layout->addWidget(page->sv);
    }
}